

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

Matcher<const_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_&>
* __thiscall
testing::internal::ElementsAreMatcher::operator_cast_to_Matcher
          (Matcher<const_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_&>
           *__return_storage_ptr__,ElementsAreMatcher *this)

{
  ElementsAreMatcherImpl<std::set<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>const&>
  *this_00;
  undefined4 *puVar1;
  MatcherVec matchers;
  IterateOverTuple<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>,_1UL>
  local_29;
  vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
  local_28;
  
  local_28.
  super__Vector_base<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> *)0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> *)0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
  ::reserve(&local_28,1);
  TransformTupleValuesHelper<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>,_testing::internal::CastAndAppendTransform<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>_>
  ::
  IterateOverTuple<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>,_1UL>
  ::operator()(&local_29,this,&local_28);
  this_00 = (ElementsAreMatcherImpl<std::set<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>const&>
             *)operator_new(0x20);
  ElementsAreMatcherImpl<std::set<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>const&>
  ::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>*,std::vector<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>,std::allocator<testing::Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>>>>>
            (this_00,(__normal_iterator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_*,_std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
                      )local_28.
                       super__Vector_base<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_*,_std::vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>_>
              )local_28.
               super__Vector_base<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->
  super_MatcherBase<const_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001ae270;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_&>
  ).vtable_ = (VTable *)
              MatcherBase<std::set<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>const&>
              ::
              GetVTable<testing::internal::MatcherBase<std::set<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>const&>::ValuePolicy<testing::MatcherInterface<std::set<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>const&>const*,true>>()
              ::kVTable;
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 1;
  *(ElementsAreMatcherImpl<std::set<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>const&>
    **)(puVar1 + 2) = this_00;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_&>
  ).buffer_.ptr = puVar1;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001ae200;
  std::
  vector<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
  ::~vector(&local_28);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    GTEST_COMPILE_ASSERT_(
        !IsHashTable<GTEST_REMOVE_REFERENCE_AND_CONST_(Container)>::value ||
            ::std::tuple_size<MatcherTuple>::value < 2,
        use_UnorderedElementsAre_with_hash_tables);

    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&> > MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(new ElementsAreMatcherImpl<const Container&>(
        matchers.begin(), matchers.end()));
  }